

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field.hh
# Opt level: O0

void __thiscall
discordpp::
field<std::vector<discordpp::ApplicationCommandOptionChoice,_std::allocator<discordpp::ApplicationCommandOptionChoice>_>_>
::field(field<std::vector<discordpp::ApplicationCommandOptionChoice,_std::allocator<discordpp::ApplicationCommandOptionChoice>_>_>
        *this,field<std::vector<discordpp::ApplicationCommandOptionChoice,_std::allocator<discordpp::ApplicationCommandOptionChoice>_>_>
              *f)

{
  bool bVar1;
  field<std::vector<discordpp::ApplicationCommandOptionChoice,_std::allocator<discordpp::ApplicationCommandOptionChoice>_>_>
  *f_local;
  field<std::vector<discordpp::ApplicationCommandOptionChoice,_std::allocator<discordpp::ApplicationCommandOptionChoice>_>_>
  *this_local;
  
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)f);
  if (bVar1) {
    std::
    unique_ptr<std::vector<discordpp::ApplicationCommandOptionChoice,_std::allocator<discordpp::ApplicationCommandOptionChoice>_>,_std::default_delete<std::vector<discordpp::ApplicationCommandOptionChoice,_std::allocator<discordpp::ApplicationCommandOptionChoice>_>_>_>
    ::operator*(&f->t_);
    std::
    make_unique<std::vector<discordpp::ApplicationCommandOptionChoice,std::allocator<discordpp::ApplicationCommandOptionChoice>>,std::vector<discordpp::ApplicationCommandOptionChoice,std::allocator<discordpp::ApplicationCommandOptionChoice>>&>
              ((vector<discordpp::ApplicationCommandOptionChoice,_std::allocator<discordpp::ApplicationCommandOptionChoice>_>
                *)this);
  }
  else {
    std::
    unique_ptr<std::vector<discordpp::ApplicationCommandOptionChoice,std::allocator<discordpp::ApplicationCommandOptionChoice>>,std::default_delete<std::vector<discordpp::ApplicationCommandOptionChoice,std::allocator<discordpp::ApplicationCommandOptionChoice>>>>
    ::
    unique_ptr<std::default_delete<std::vector<discordpp::ApplicationCommandOptionChoice,std::allocator<discordpp::ApplicationCommandOptionChoice>>>,void>
              ((unique_ptr<std::vector<discordpp::ApplicationCommandOptionChoice,std::allocator<discordpp::ApplicationCommandOptionChoice>>,std::default_delete<std::vector<discordpp::ApplicationCommandOptionChoice,std::allocator<discordpp::ApplicationCommandOptionChoice>>>>
                *)this,(nullptr_t)0x0);
  }
  this->s_ = f->s_;
  return;
}

Assistant:

field(const field<T> &f)
        : t_(f.t_ ? std::make_unique<T>(*f.t_) : nullptr), s_(f.s_) {}